

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::
ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::ApplyVar(ApplyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *this,ApplyFunc *func,VariableP<tcu::Matrix<float,_2,_4>_> *arg0,
          VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg1,
          VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg2,
          VariableP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
  SStack_68;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
  local_58;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
  local_48;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_> local_38;
  
  VariableP::operator_cast_to_ExprP((VariableP *)&local_38);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  VariableP::operator_cast_to_ExprP((VariableP *)&local_58);
  VariableP::operator_cast_to_ExprP((VariableP *)&SStack_68);
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Apply(&this->
           super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          ,func,(ExprP<tcu::Matrix<float,_2,_4>_> *)&local_38,
          (ExprP<deqp::gls::BuiltinPrecisionTests::Void> *)&local_48,
          (ExprP<deqp::gls::BuiltinPrecisionTests::Void> *)&local_58,
          (ExprP<deqp::gls::BuiltinPrecisionTests::Void> *)&SStack_68);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>::
  release(&SStack_68);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>::
  release(&local_58);
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>::
  release(&local_48);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_4>_>_>::release
            (&local_38);
  (this->
  super_Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ).super_Expr<tcu::Matrix<float,_4,_2>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__Apply_01e6c7c8;
  return;
}

Assistant:

ApplyVar	(const ApplyFunc&			func,
									 const VariableP<Arg0>&		arg0,
									 const VariableP<Arg1>&		arg1,
									 const VariableP<Arg2>&		arg2,
									 const VariableP<Arg3>&		arg3)
							: Apply<Sig> (func, arg0, arg1, arg2, arg3) {}